

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

bool CheckIfExitIsGood(AActor *self,level_info_t *info)

{
  char *pcVar1;
  cluster_info_t *pcVar2;
  DAngle in_XMM0_Qa;
  FName local_24;
  undefined8 local_20;
  
  if (self == (AActor *)0x0) {
    return true;
  }
  if (((dmflags2.Value._2_1_ & 2) == 0) || (level.killed_monsters == level.total_monsters)) {
    if (((deathmatch.Value != 0) || (alwaysapplydmflags.Value)) && ((dmflags.Value._1_1_ & 4) != 0))
    {
      local_24.Index = 0xc4;
      local_20 = 0;
      P_DamageMobj(self,self,self,1000000,&local_24,0,in_XMM0_Qa);
      return false;
    }
    if ((((0 < self->health) || (info == (level_info_t *)0x0)) || (multiplayer)) ||
       (((info->cluster != level.cluster ||
         (pcVar2 = FindClusterInfo(info->cluster), pcVar2 == (cluster_info_t *)0x0)) ||
        ((pcVar2->flags & 1) == 0)))) {
      if (deathmatch.Value == 0) {
        return true;
      }
      if (gameaction == ga_completed) {
        return true;
      }
      pcVar1 = userinfo_t::GetName(&self->player->userinfo);
      Printf("%s exited the level.\n",pcVar1);
      return true;
    }
  }
  return false;
}

Assistant:

bool CheckIfExitIsGood (AActor *self, level_info_t *info)
{
	cluster_info_t *cluster;

	// The world can always exit itself.
	if (self == NULL)
		return true;

	// We must kill all monsters to exit the level.
	if ((dmflags2 & DF2_KILL_MONSTERS) && level.killed_monsters != level.total_monsters)
		return false;

	// Is this a deathmatch game and we're not allowed to exit?
	if ((deathmatch || alwaysapplydmflags) && (dmflags & DF_NO_EXIT))
	{
		P_DamageMobj (self, self, self, TELEFRAG_DAMAGE, NAME_Exit);
		return false;
	}
	// Is this a singleplayer game and the next map is part of the same hub and we're dead?
	if (self->health <= 0 &&
		!multiplayer &&
		info != NULL &&
		info->cluster == level.cluster &&
		(cluster = FindClusterInfo(level.cluster)) != NULL &&
		cluster->flags & CLUSTER_HUB)
	{
		return false;
	}
	if (deathmatch && gameaction != ga_completed)
	{
		Printf ("%s exited the level.\n", self->player->userinfo.GetName());
	}
	return true;
}